

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O3

void __thiscall
TEST_SimpleStringBuffer_resetWriteLimit_Test::testBody
          (TEST_SimpleStringBuffer_resetWriteLimit_Test *this)

{
  char *pcVar1;
  UtestShell *pUVar2;
  char *pcVar3;
  TestTerminator *pTVar4;
  int iVar5;
  SimpleString str;
  SimpleStringBuffer buffer;
  SimpleString local_1040;
  SimpleStringBuffer local_1030;
  
  SimpleStringBuffer::SimpleStringBuffer(&local_1030);
  SimpleStringBuffer::setWriteLimit(&local_1030,10);
  iVar5 = 0x1000;
  do {
    SimpleStringBuffer::add(&local_1030,"h");
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  SimpleStringBuffer::resetWriteLimit(&local_1030);
  SimpleString::SimpleString(&local_1040,"h",10);
  pcVar1 = SimpleString::asCharString(&local_1040);
  SimpleStringBuffer::add(&local_1030,"%s",pcVar1);
  SimpleString::~SimpleString(&local_1040);
  SimpleString::SimpleString(&local_1040,"h",0x14);
  pUVar2 = UtestShell::getCurrent();
  pcVar1 = SimpleString::asCharString(&local_1040);
  pcVar3 = SimpleStringBuffer::toString(&local_1030);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[9])
            (pUVar2,pcVar1,pcVar3,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0x26d,pTVar4);
  SimpleString::~SimpleString(&local_1040);
  return;
}

Assistant:

TEST(SimpleStringBuffer, resetWriteLimit)
{
    SimpleStringBuffer buffer;
    buffer.setWriteLimit(10);
    for (int i = 0; i < SimpleStringBuffer::SIMPLE_STRING_BUFFER_LEN ; i++)
        buffer.add("h");
    buffer.resetWriteLimit();
    buffer.add("%s", SimpleString("h", 10).asCharString());

    SimpleString str("h", 20);
    STRCMP_EQUAL(str.asCharString(), buffer.toString());
}